

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O3

bool __thiscall
ON_BinaryArchive::BeginRead3dmBigChunk(ON_BinaryArchive *this,uint *typecode,ON__INT64 *value)

{
  ulong uVar1;
  ulong offset;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  ON__UINT64 offset_00;
  ON__UINT32 typecode_00;
  ON__UINT64 EOF_chunk_length;
  bool bVar5;
  ON__INT64 v;
  ON__UINT32 tc;
  ulong local_40;
  undefined8 local_38;
  
  bVar2 = ReadMode(this);
  if (!bVar2) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
               ,0x1893,"","ReadMode() = false.");
    if (typecode != (uint *)0x0) {
      *typecode = 0;
    }
    if (value != (ON__INT64 *)0x0) {
      *value = 0;
    }
    return false;
  }
  local_40 = 0;
  this->m_bDoChunkCRC = false;
  uVar4 = this->m_error_message_mask;
  this->m_error_message_mask = uVar4 | 1;
  local_38 = (ulong)local_38._4_4_ << 0x20;
  bVar2 = ReadInt32(this,1,(ON__INT32 *)&local_38);
  if (bVar2) {
    typecode_00 = (ON__UINT32)local_38;
    this->m_error_message_mask = uVar4;
    if ((ON__UINT32)local_38 == 0x7fff) {
      local_38 = 0;
      bVar2 = ReadChunkValue(this,0x7fff,(ON__INT64 *)&local_40);
      offset = local_40;
      if (((long)local_40 < 0 || !bVar2) || (local_40 < (ulong)(0x31 < this->m_3dm_version) * 4 + 4)
         ) {
        typecode_00 = 0;
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                   ,0x18d5,"","ON_BinaryArchive::BeginRead3dmChunk() - file is damaged.");
        goto LAB_00393261;
      }
      uVar1 = this->m_current_positionX;
      bVar2 = ReadEOFSizeOfFile(this,&local_38);
      offset_00 = this->m_current_positionX - uVar1;
      if ((this->m_current_positionX < uVar1 || offset_00 == 0) || uVar1 == 0) {
        if (!bVar2) {
          typecode_00 = 0x7fff;
          goto LAB_00393261;
        }
      }
      else {
        bVar5 = false;
        bVar3 = Internal_SeekCur(this,false,offset_00);
        if (!bVar2 || !bVar3) {
          typecode_00 = 0x7fff;
          goto LAB_00393264;
        }
      }
      bVar2 = Internal_SeekCur(this,true,offset);
      typecode_00 = 0x7fff;
      if (bVar2) {
        if (this->m_3dm_version < 2) {
          uVar4 = (*this->_vptr_ON_BinaryArchive[5])(this);
          typecode_00 = uVar4 & 0xff | 0x7ffe;
        }
        else if (this->m_current_positionX != local_38) {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                     ,0x18ca,"",
                     "ON_BinaryArchive::BeginRead3dmChunk() - Rogue eof marker in v2 file.\n");
        }
        bVar5 = false;
        bVar2 = Internal_SeekCur(this,false,offset);
        if (!bVar2) goto LAB_00393264;
      }
    }
    else {
      bVar2 = ReadChunkValue(this,(ON__UINT32)local_38,(ON__INT64 *)&local_40);
      if (!bVar2) goto LAB_00393261;
    }
    PushBigChunk(this,typecode_00,local_40);
    bVar5 = true;
  }
  else {
    this->m_error_message_mask = uVar4;
    typecode_00 = 0;
LAB_00393261:
    bVar5 = false;
  }
LAB_00393264:
  if (typecode != (uint *)0x0) {
    *typecode = typecode_00;
  }
  if (value != (ON__INT64 *)0x0) {
    *value = local_40;
  }
  return bVar5;
}

Assistant:

bool ON_BinaryArchive::BeginRead3dmBigChunk( unsigned int* typecode, ON__INT64* value )
{
  if (false == ReadMode())
  {
    ON_ERROR("ReadMode() = false.");
    if (typecode)
      *typecode = 0;
    if (value)
      *value = 0;
    return false;
  }

  ON__UINT32 t = 0;
  ON__INT64 v = 0;
  m_bDoChunkCRC = false; // no CRC on chunk headers because length is written twice
  const unsigned int saved_error_message_mask = m_error_message_mask;
  m_error_message_mask |= 0x0001; // disable ReadByte() error message at EOF
  bool rc = ReadChunkTypecode( &t );
  m_error_message_mask = saved_error_message_mask;
  if (rc) 
  {
    if ( t == TCODE_ENDOFFILE ) 
    {
      // Either this chunk is a bona fide end of file mark, or it's "goo" 
      // that Rhino 1.0 or the pre-February 2000 Rhino 1.1 saved and wrote.
      ON__UINT64 sizeof_file = 0;
      if ( rc )
        rc = ReadChunkValue( t, &v );
      if ( rc && v >= 0 && ((ON__UINT64)v) >= SizeofChunkLength() ) 
      {
        ON__UINT64 EOF_chunk_length = (ON__UINT64)v;
        ON__UINT64 pos0 = CurrentPosition();
        rc = ReadEOFSizeOfFile( &sizeof_file );
        ON__UINT64 pos1 = CurrentPosition();
        if ( pos0 > 0 && pos1 > pos0 )
        {
          if ( !SeekBackward(pos1-pos0) )
            rc = false;
        }
        if ( rc ) 
        {
          if ( SeekForward( EOF_chunk_length ) )
          {
            ON__UINT64 pos2 = CurrentPosition(); 
            if ( m_3dm_version <= 1 )
            {
              if ( !AtEnd() ) 
              {
                // Rhino v1 reads chunks with unknown typecodes as a block of "goo"
                // and then saves them back into file.  When this happens to an
                // eof marker, we get TCODE_ENDOFFILE chunks in the middle of a file.
                // This can only happen in m_3dm_version = 1 files.
                t = TCODE_ENDOFFILE_GOO;
              }
            }
            else
            {
              // check that current position matches saved file size
              if ( pos2 != sizeof_file ) {
                ON_ERROR("ON_BinaryArchive::BeginRead3dmChunk() - Rogue eof marker in v2 file.\n");
              }
            }
            rc = SeekBackward( EOF_chunk_length );
          }
        }
        if ( rc )
          rc = PushBigChunk( t, v );
      }
      else 
      {
        ON_ERROR( "ON_BinaryArchive::BeginRead3dmChunk() - file is damaged." );
        rc = false;
        t = 0; // ?? file is trashed ??
      }
    }
    else 
    {
      if ( rc )
        rc = ReadChunkValue( t, &v );
      if ( rc )
        rc = PushBigChunk( t, v );
    }
  }
  if ( typecode )
    *typecode = t;
  if ( value )
    *value = v;
  return rc;
}